

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setclassudsize(HSQUIRRELVM v,SQInteger idx,SQInteger udsize)

{
  SQObjectPtr *err;
  HSQUIRRELVM in_RDX;
  SQObjectPtr *o;
  SQInteger in_stack_ffffffffffffffd8;
  SQRESULT local_8;
  
  err = stack_get(in_RDX,in_stack_ffffffffffffffd8);
  if ((err->super_SQObject)._type == OT_CLASS) {
    if ((((err->super_SQObject)._unVal.pClass)->_locked & 1U) == 0) {
      *(HSQUIRRELVM *)((err->super_SQObject)._unVal.nInteger + 0x1c0) = in_RDX;
      local_8 = 0;
    }
    else {
      local_8 = sq_throwerror(in_RDX,(SQChar *)err);
    }
  }
  else {
    local_8 = sq_throwerror(in_RDX,(SQChar *)err);
  }
  return local_8;
}

Assistant:

SQRESULT sq_setclassudsize(HSQUIRRELVM v, SQInteger idx, SQInteger udsize)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(sq_type(o) != OT_CLASS) return sq_throwerror(v,_SC("the object is not a class"));
    if(_class(o)->_locked) return sq_throwerror(v,_SC("the class is locked"));
    _class(o)->_udsize = udsize;
    return SQ_OK;
}